

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_date.cpp
# Opt level: O1

bool ON_GetGregorianMonthAndDayOfMonth(uint year,uint day_of_year,uint *month,uint *date)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  undefined1 *puVar4;
  
  uVar3 = 0;
  uVar1 = 0;
  if (0x62d < year) {
    if ((year & 3) == 0 && 0x657 < year) {
      if ((year * -0x3d70a3d7 >> 4 | year * -0x70000000) < 0xa3d70b) {
        puVar4 = LeapYearDayCount()::leap_year_day_count;
      }
      else {
        puVar4 = LeapYearDayCount()::leap_year_day_count;
        if ((year * -0x3d70a3d7 >> 2 | year * 0x40000000) < 0x28f5c29) {
          puVar4 = CommonYearDayCount()::common_year_day_count;
        }
      }
    }
    else {
      puVar4 = CommonYearDayCount()::common_year_day_count;
    }
    lVar2 = 1;
    do {
      if (day_of_year <= *(uint *)(puVar4 + lVar2 * 4)) {
        uVar3 = day_of_year - *(int *)(puVar4 + lVar2 * 4 + -4);
        goto LAB_0043721a;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0xd);
    uVar3 = 0;
    lVar2 = 0xd;
LAB_0043721a:
    uVar1 = (uint)lVar2;
    if (uVar3 == 0) {
      uVar1 = 0;
    }
  }
  if (month != (uint *)0x0) {
    *month = uVar1;
  }
  if (date != (uint *)0x0) {
    *date = uVar3;
  }
  return uVar3 != 0;
}

Assistant:

bool ON_GetGregorianMonthAndDayOfMonth(
  unsigned int year,
  unsigned int day_of_year,
  unsigned int* month,
  unsigned int* date
  )
{
  unsigned int mm = 0;
  unsigned int dd = 0;
  if( year >= FIRST_GREGORIAN_YEAR )
  {
    const unsigned int* year_day_count = YearDayCount(year);
    for ( mm = 1; mm <= 12; mm++ )
    {
      if ( day_of_year <= year_day_count[mm] )
      {
        dd = day_of_year - year_day_count[mm-1];
        break;
      }
    }
    if ( 0 == dd )
      mm = dd;
  }

  if ( 0 != month )
    *month = mm;

  if ( 0 != date )
    *date = dd;

  return (0 != dd);
}